

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipasir.cc
# Opt level: O1

void __thiscall IPAsirMiniSAT::~IPAsirMiniSAT(IPAsirMiniSAT *this)

{
  ~IPAsirMiniSAT(this);
  operator_delete(this);
  return;
}

Assistant:

~IPAsirMiniSAT() { reset(); }